

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int setupLookaside(sqlite3 *db,void *pBuf,int sz,int cnt)

{
  int iVar1;
  int in_ECX;
  uint in_EDX;
  undefined8 *in_RSI;
  long in_RDI;
  LookasideSlot *p;
  int i;
  int nSm;
  int nBig;
  sqlite3_int64 szAlloc;
  void *pStart;
  int *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_38;
  int local_34;
  long local_30;
  undefined8 *local_28;
  int local_20;
  uint local_1c;
  int local_4;
  
  iVar1 = sqlite3LookasideUsed
                    ((sqlite3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
  if (iVar1 < 1) {
    if (*(char *)(in_RDI + 0x1a0) != '\0') {
      sqlite3_free((void *)0x14aaa3);
    }
    local_1c = in_EDX & 0xfffffff8;
    if ((int)local_1c < 9) {
      local_1c = 0;
    }
    if (0xfff8 < (int)local_1c) {
      local_1c = 0xfff8;
    }
    local_20 = in_ECX;
    if (in_ECX < 0) {
      local_20 = 0;
    }
    local_30 = (long)(int)local_1c * (long)local_20;
    if ((local_1c == 0) || (local_20 == 0)) {
      local_1c = 0;
      local_28 = (undefined8 *)0x0;
    }
    else {
      local_28 = in_RSI;
      if (in_RSI == (undefined8 *)0x0) {
        sqlite3BeginBenignMalloc();
        local_28 = (undefined8 *)
                   sqlite3Malloc(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        sqlite3EndBenignMalloc();
        if (local_28 != (undefined8 *)0x0) {
          iVar1 = sqlite3MallocSize((void *)0x14ab45);
          local_30 = (long)iVar1;
        }
      }
    }
    if ((int)local_1c < 0x180) {
      if ((int)local_1c < 0x100) {
        if ((int)local_1c < 1) {
          local_34 = 0;
        }
        else {
          local_34 = (int)(local_30 / (long)(int)local_1c);
        }
        local_38 = 0;
      }
      else {
        local_34 = (int)(local_30 / (long)(int)(local_1c + 0x80));
        local_38 = (int)((local_30 - (long)(int)local_1c * (long)local_34) / 0x80);
      }
    }
    else {
      local_34 = (int)(local_30 / (long)(int)(local_1c + 0x180));
      local_38 = (int)((local_30 - (long)(int)local_1c * (long)local_34) / 0x80);
    }
    *(undefined8 **)(in_RDI + 0x1e0) = local_28;
    *(undefined8 *)(in_RDI + 0x1b8) = 0;
    *(undefined8 *)(in_RDI + 0x1c0) = 0;
    *(short *)(in_RDI + 0x19c) = (short)local_1c;
    *(short *)(in_RDI + 0x19e) = (short)local_1c;
    if (local_28 == (undefined8 *)0x0) {
      *(undefined8 *)(in_RDI + 0x1e0) = 0;
      *(undefined8 *)(in_RDI + 0x1c8) = 0;
      *(undefined8 *)(in_RDI + 0x1d0) = 0;
      *(undefined8 *)(in_RDI + 0x1d8) = 0;
      *(undefined8 *)(in_RDI + 0x1e8) = 0;
      *(undefined4 *)(in_RDI + 0x198) = 1;
      *(undefined2 *)(in_RDI + 0x19c) = 0;
      *(undefined1 *)(in_RDI + 0x1a0) = 0;
      *(undefined4 *)(in_RDI + 0x1a4) = 0;
    }
    else {
      for (iVar1 = 0; iVar1 < local_34; iVar1 = iVar1 + 1) {
        *local_28 = *(undefined8 *)(in_RDI + 0x1b8);
        *(undefined8 **)(in_RDI + 0x1b8) = local_28;
        local_28 = (undefined8 *)((long)local_28 + (long)(int)local_1c);
      }
      *(undefined8 *)(in_RDI + 0x1c8) = 0;
      *(undefined8 *)(in_RDI + 0x1d0) = 0;
      *(undefined8 **)(in_RDI + 0x1d8) = local_28;
      for (iVar1 = 0; iVar1 < local_38; iVar1 = iVar1 + 1) {
        *local_28 = *(undefined8 *)(in_RDI + 0x1c8);
        *(undefined8 **)(in_RDI + 0x1c8) = local_28;
        local_28 = local_28 + 0x10;
      }
      *(undefined8 **)(in_RDI + 0x1e8) = local_28;
      *(undefined4 *)(in_RDI + 0x198) = 0;
      *(bool *)(in_RDI + 0x1a0) = in_RSI == (undefined8 *)0x0;
      *(int *)(in_RDI + 0x1a4) = local_34 + local_38;
    }
    *(undefined8 *)(in_RDI + 0x1f0) = *(undefined8 *)(in_RDI + 0x1e8);
    local_4 = 0;
  }
  else {
    local_4 = 5;
  }
  return local_4;
}

Assistant:

static int setupLookaside(sqlite3 *db, void *pBuf, int sz, int cnt){
#ifndef SQLITE_OMIT_LOOKASIDE
  void *pStart;
  sqlite3_int64 szAlloc;
  int nBig;   /* Number of full-size slots */
  int nSm;    /* Number smaller LOOKASIDE_SMALL-byte slots */

  if( sqlite3LookasideUsed(db,0)>0 ){
    return SQLITE_BUSY;
  }
  /* Free any existing lookaside buffer for this handle before
  ** allocating a new one so we don't have to have space for
  ** both at the same time.
  */
  if( db->lookaside.bMalloced ){
    sqlite3_free(db->lookaside.pStart);
  }
  /* The size of a lookaside slot after ROUNDDOWN8 needs to be larger
  ** than a pointer to be useful.
  */
  sz = ROUNDDOWN8(sz);  /* IMP: R-33038-09382 */
  if( sz<=(int)sizeof(LookasideSlot*) ) sz = 0;
  if( sz>65528 ) sz = 65528;
  if( cnt<0 ) cnt = 0;
  szAlloc = (i64)sz*(i64)cnt;
  if( sz==0 || cnt==0 ){
    sz = 0;
    pStart = 0;
  }else if( pBuf==0 ){
    sqlite3BeginBenignMalloc();
    pStart = sqlite3Malloc( szAlloc );  /* IMP: R-61949-35727 */
    sqlite3EndBenignMalloc();
    if( pStart ) szAlloc = sqlite3MallocSize(pStart);
  }else{
    pStart = pBuf;
  }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
  if( sz>=LOOKASIDE_SMALL*3 ){
    nBig = szAlloc/(3*LOOKASIDE_SMALL+sz);
    nSm = (szAlloc - (i64)sz*(i64)nBig)/LOOKASIDE_SMALL;
  }else if( sz>=LOOKASIDE_SMALL*2 ){
    nBig = szAlloc/(LOOKASIDE_SMALL+sz);
    nSm = (szAlloc - (i64)sz*(i64)nBig)/LOOKASIDE_SMALL;
  }else
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
  if( sz>0 ){
    nBig = szAlloc/sz;
    nSm = 0;
  }else{
    nBig = nSm = 0;
  }
  db->lookaside.pStart = pStart;
  db->lookaside.pInit = 0;
  db->lookaside.pFree = 0;
  db->lookaside.sz = (u16)sz;
  db->lookaside.szTrue = (u16)sz;
  if( pStart ){
    int i;
    LookasideSlot *p;
    assert( sz > (int)sizeof(LookasideSlot*) );
    p = (LookasideSlot*)pStart;
    for(i=0; i<nBig; i++){
      p->pNext = db->lookaside.pInit;
      db->lookaside.pInit = p;
      p = (LookasideSlot*)&((u8*)p)[sz];
    }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
    db->lookaside.pSmallInit = 0;
    db->lookaside.pSmallFree = 0;
    db->lookaside.pMiddle = p;
    for(i=0; i<nSm; i++){
      p->pNext = db->lookaside.pSmallInit;
      db->lookaside.pSmallInit = p;
      p = (LookasideSlot*)&((u8*)p)[LOOKASIDE_SMALL];
    }
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
    assert( ((uptr)p)<=szAlloc + (uptr)pStart );
    db->lookaside.pEnd = p;
    db->lookaside.bDisable = 0;
    db->lookaside.bMalloced = pBuf==0 ?1:0;
    db->lookaside.nSlot = nBig+nSm;
  }else{
    db->lookaside.pStart = 0;
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
    db->lookaside.pSmallInit = 0;
    db->lookaside.pSmallFree = 0;
    db->lookaside.pMiddle = 0;
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
    db->lookaside.pEnd = 0;
    db->lookaside.bDisable = 1;
    db->lookaside.sz = 0;
    db->lookaside.bMalloced = 0;
    db->lookaside.nSlot = 0;
  }
  db->lookaside.pTrueEnd = db->lookaside.pEnd;
  assert( sqlite3LookasideUsed(db,0)==0 );
#endif /* SQLITE_OMIT_LOOKASIDE */
  return SQLITE_OK;
}